

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PthreadService.cpp
# Opt level: O0

void anon_unknown.dwarf_47a899::post_init_cb(Caliper *c,Channel *channel)

{
  Channel *pCVar1;
  Events *pEVar2;
  cali_variant_t local_50;
  Variant local_40;
  Variant local_30;
  pthread_t local_20;
  uint64_t id;
  Channel *channel_local;
  Caliper *c_local;
  
  id = (uint64_t)channel;
  channel_local = (Channel *)c;
  pEVar2 = cali::Channel::events(channel);
  cali::util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
            (&pEVar2->subscribe_attribute,(Caliper **)&channel_local,
             (Attribute *)&(anonymous_namespace)::id_attr);
  if ((post_init_cb::is_wrapped & 1U) == 0) {
    gotcha_wrap(post_init_cb::pthread_binding,1,"caliper/pthread");
    post_init_cb::is_wrapped = true;
    local_20 = pthread_self();
    pCVar1 = channel_local;
    cali::Variant::Variant(&local_30,true);
    cali::Caliper::set((Caliper *)pCVar1,(Attribute *)&(anonymous_namespace)::master_attr,&local_30)
    ;
    pCVar1 = channel_local;
    local_50 = cali_make_variant_from_uint(local_20);
    cali::Variant::Variant(&local_40,&local_50);
    cali::Caliper::set((Caliper *)pCVar1,(Attribute *)&(anonymous_namespace)::id_attr,&local_40);
  }
  return;
}

Assistant:

void post_init_cb(Caliper* c, Channel* channel)
{
    channel->events().subscribe_attribute(c, id_attr);

    static bool is_wrapped = false;

    if (!is_wrapped) {
        static struct gotcha_binding_t pthread_binding[] = {
            { "pthread_create", (void*) cali_pthread_create_wrapper, &orig_pthread_create_handle }
        };

        gotcha_wrap(pthread_binding, sizeof(pthread_binding) / sizeof(struct gotcha_binding_t), "caliper/pthread");

        is_wrapped = true;

        uint64_t id = static_cast<uint64_t>(pthread_self());

        c->set(master_attr, Variant(true));
        c->set(id_attr, Variant(cali_make_variant_from_uint(id)));
    }
}